

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

void __thiscall cfgfile::generator::cfg::class_t::class_t(class_t *this)

{
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  std::__cxx11::string::string(in_RDI + 0x40,(string *)c_no_value_tag_name_abi_cxx11_);
  std::__cxx11::string::string(in_RDI + 0x60);
  std::vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>::
  vector((vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
          *)0x1093a9);
  *(undefined8 *)(in_RDI + 0x98) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0xa0) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0xa8) = 0;
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  return;
}

Assistant:

class_t::class_t()
	:	m_base_name( c_no_value_tag_name )
	,	m_line_number( -1 )
	,	m_column_number( -1 )
	,	m_index( 0 )
	,	m_parent( 0 )
{
}